

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<double,double,double,duckdb::BinaryZeroIsNullWrapper,duckdb::ModuloOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  byte bVar1;
  bool bVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  byte in_CL;
  Vector *in_RDX;
  undefined8 in_RDI;
  double dVar6;
  Vector *unaff_retaddr;
  double *result_data;
  double *rdata;
  double *ldata;
  idx_t in_stack_ffffffffffffffa8;
  ValidityMask *mask;
  undefined7 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 is_null;
  
  is_null = (undefined1)((ulong)in_RDI >> 0x38);
  bVar1 = in_CL & 1;
  Vector::SetVectorType
            ((Vector *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
             (VectorType)((ulong)in_stack_ffffffffffffffd8 >> 0x38));
  pdVar3 = ConstantVector::GetData<double>((Vector *)0x136a0c4);
  pdVar4 = ConstantVector::GetData<double>((Vector *)0x136a0d3);
  pdVar5 = ConstantVector::GetData<double>((Vector *)0x136a0e2);
  bVar2 = ConstantVector::IsNull((Vector *)0x136a0f1);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x136a0ff), !bVar2)) {
    mask = (ValidityMask *)*pdVar3;
    dVar6 = *pdVar4;
    ConstantVector::Validity(in_RDX);
    dVar6 = BinaryZeroIsNullWrapper::Operation<bool,duckdb::ModuloOperator,double,double,double>
                      (SUB81((ulong)pdVar5 >> 0x38,0),
                       (double)CONCAT17(bVar1,in_stack_ffffffffffffffc0),dVar6,mask,
                       in_stack_ffffffffffffffa8);
    *pdVar5 = dVar6;
    return;
  }
  ConstantVector::SetNull(unaff_retaddr,(bool)is_null);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}